

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_3> * tcu::operator-(Matrix<float,_4,_3> *a,Matrix<float,_4,_3> *b)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector<float,_4> *pVVar12;
  Matrix<float,_4,_3> *res;
  Matrix<float,_4,_3> *in_RDI;
  long lVar13;
  int row;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  bool bVar18;
  undefined4 uVar19;
  long lVar17;
  
  (in_RDI->m_data).m_data[2].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[2].m_data[1] = 0.0;
  pVVar12 = (in_RDI->m_data).m_data;
  pVVar12[2].m_data[2] = 0.0;
  pVVar12[2].m_data[3] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[1] = 0.0;
  pVVar12 = (in_RDI->m_data).m_data;
  pVVar12[1].m_data[2] = 0.0;
  pVVar12[1].m_data[3] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[2] = 0.0;
  auVar11 = _DAT_019f34d0;
  auVar10 = _DAT_019ec5b0;
  (in_RDI->m_data).m_data[0].m_data[3] = 0.0;
  pVVar12 = (in_RDI->m_data).m_data + 1;
  lVar13 = 0;
  lVar14 = 0;
  do {
    lVar15 = 0;
    auVar16 = auVar11;
    do {
      bVar18 = SUB164(auVar16 ^ auVar10,4) == -0x80000000 &&
               SUB164(auVar16 ^ auVar10,0) < -0x7ffffffd;
      if (bVar18) {
        uVar19 = 0x3f800000;
        if (lVar13 != lVar15) {
          uVar19 = 0;
        }
        *(undefined4 *)
         ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar12 + -1))->m_data[0].m_data + lVar15) =
             uVar19;
      }
      if (bVar18) {
        uVar19 = 0x3f800000;
        if (lVar13 + -0x10 != lVar15) {
          uVar19 = 0;
        }
        *(undefined4 *)((long)pVVar12->m_data + lVar15) = uVar19;
      }
      lVar17 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar17 + 2;
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0x40);
    lVar14 = lVar14 + 1;
    lVar13 = lVar13 + 0x10;
    pVVar12 = (Vector<float,_4> *)(pVVar12->m_data + 1);
  } while (lVar14 != 4);
  lVar13 = 0;
  do {
    pfVar1 = (float *)((long)(a->m_data).m_data[0].m_data + lVar13);
    fVar4 = pfVar1[1];
    fVar5 = pfVar1[2];
    fVar6 = pfVar1[3];
    pfVar2 = (float *)((long)(b->m_data).m_data[0].m_data + lVar13);
    fVar7 = pfVar2[1];
    fVar8 = pfVar2[2];
    fVar9 = pfVar2[3];
    pfVar3 = (float *)((long)(in_RDI->m_data).m_data[0].m_data + lVar13);
    *pfVar3 = *pfVar1 - *pfVar2;
    pfVar3[1] = fVar4 - fVar7;
    pfVar3[2] = fVar5 - fVar8;
    pfVar3[3] = fVar6 - fVar9;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x30);
  return in_RDI;
}

Assistant:

Matrix<T, Rows, Cols> operator- (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) - b(row, col);
	return res;
}